

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

lysc_node * lyd_parser_node_schema(lyd_node *node)

{
  uint32_t uVar1;
  lyd_node *plVar2;
  lys_module *module;
  lysc_node *parent;
  lysc_node **pplVar3;
  uint32_t idx;
  
  if (node == (lyd_node *)0x0) {
LAB_00165bfc:
    parent = (lysc_node *)0x0;
  }
  else {
    parent = node->schema;
    if (parent == (lysc_node *)0x0) {
      uVar1 = ly_log_location_dnode_count();
      do {
        idx = uVar1;
        if (idx == 0) {
          idx = 0;
          parent = (lysc_node *)0x0;
          goto LAB_00165b92;
        }
        plVar2 = ly_log_location_dnode(idx - 1);
        uVar1 = idx - 1;
      } while (plVar2->schema == (lysc_node *)0x0);
      plVar2 = ly_log_location_dnode(idx - 1);
      parent = plVar2->schema;
LAB_00165b92:
      do {
        uVar1 = ly_log_location_dnode_count();
        plVar2 = node;
        if (idx != uVar1) {
          plVar2 = ly_log_location_dnode(idx);
        }
        if (plVar2->schema != (lysc_node *)0x0) {
          __assert_fail("!iter->schema",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                        ,0xd5,
                        "const struct lysc_node *lyd_parser_node_schema(const struct lyd_node *)");
        }
        module = lyd_node_module(plVar2);
        if (module == (lys_module *)0x0) goto LAB_00165bfc;
        pplVar3 = (lysc_node **)&plVar2->schema->name;
        if (plVar2->schema == (lysc_node *)0x0) {
          pplVar3 = &plVar2[1].schema;
        }
        parent = lys_find_child(parent,module,(char *)*pplVar3,0,0,0);
      } while ((plVar2 != node) && (idx = idx + 1, parent != (lysc_node *)0x0));
    }
  }
  return parent;
}

Assistant:

const struct lysc_node *
lyd_parser_node_schema(const struct lyd_node *node)
{
    uint32_t i;
    const struct lyd_node *iter;
    const struct lysc_node *schema = NULL;
    const struct lys_module *mod;

    if (!node) {
        return NULL;
    } else if (node->schema) {
        /* simplest case */
        return node->schema;
    }

    /* find the first schema node in the parsed nodes */
    i = ly_log_location_dnode_count();
    if (i) {
        do {
            --i;
            if (ly_log_location_dnode(i)->schema) {
                /* this node is processed */
                schema = ly_log_location_dnode(i)->schema;
                ++i;
                break;
            }
        } while (i);
    }

    /* get schema node of an opaque node */
    do {
        /* get next data node */
        if (i == ly_log_location_dnode_count()) {
            iter = node;
        } else {
            iter = ly_log_location_dnode(i);
        }
        assert(!iter->schema);

        /* get module */
        mod = lyd_node_module(iter);
        if (!mod) {
            /* unknown module, no schema node */
            schema = NULL;
            break;
        }

        /* get schema node */
        schema = lys_find_child(schema, mod, LYD_NAME(iter), 0, 0, 0);

        /* move to the descendant */
        ++i;
    } while (schema && (iter != node));

    return schema;
}